

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListMatrixAddCube(Fxu_Matrix *p,Fxu_Cube *pLink)

{
  Fxu_ListCube *pList;
  Fxu_Cube *pLink_local;
  Fxu_Matrix *p_local;
  
  if ((p->lCubes).pHead == (Fxu_Cube *)0x0) {
    (p->lCubes).pHead = pLink;
    (p->lCubes).pTail = pLink;
    pLink->pPrev = (Fxu_Cube *)0x0;
    pLink->pNext = (Fxu_Cube *)0x0;
  }
  else {
    pLink->pNext = (Fxu_Cube *)0x0;
    ((p->lCubes).pTail)->pNext = pLink;
    pLink->pPrev = (p->lCubes).pTail;
    (p->lCubes).pTail = pLink;
  }
  (p->lCubes).nItems = (p->lCubes).nItems + 1;
  return;
}

Assistant:

void Fxu_ListMatrixAddCube( Fxu_Matrix * p, Fxu_Cube * pLink )
{
	Fxu_ListCube * pList = &p->lCubes;
	if ( pList->pHead == NULL )
	{
		pList->pHead = pLink;
		pList->pTail = pLink;
		pLink->pPrev = NULL;
		pLink->pNext = NULL;
	}
	else
	{
		pLink->pNext = NULL;
		pList->pTail->pNext = pLink;
		pLink->pPrev = pList->pTail;
		pList->pTail = pLink;
	}
	pList->nItems++;
}